

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv__io_start(uv_loop_t *loop,uv__io_t *w,uint events)

{
  void **ppvVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  uv__io_t **ppuVar5;
  uint uVar6;
  uv__io_t *puVar7;
  uv__io_t *local_38;
  
  if ((events & 0xffffdffa) != 0) {
    __assert_fail("0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                  ,0x33d,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (events == 0) {
    __assert_fail("0 != events",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                  ,0x33e,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  uVar6 = w->fd;
  if ((int)uVar6 < 0) {
    __assert_fail("w->fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                  ,0x33f,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (uVar6 != 0x7fffffff) {
    w->pevents = w->pevents | events;
    uVar2 = loop->nwatchers;
    if (uVar2 <= uVar6) {
      ppuVar5 = loop->watchers;
      if (ppuVar5 == (uv__io_t **)0x0) {
        local_38 = (uv__io_t *)0x0;
        puVar7 = (uv__io_t *)0x0;
      }
      else {
        puVar7 = ppuVar5[uVar2];
        local_38 = ppuVar5[(ulong)uVar2 + 1];
      }
      uVar6 = uVar6 + 2 >> 1 | uVar6 + 2;
      uVar6 = uVar6 >> 2 | uVar6;
      uVar6 = uVar6 >> 4 | uVar6;
      uVar6 = uVar6 >> 8 | uVar6;
      uVar6 = uVar6 >> 0x10 | uVar6;
      ppuVar5 = (uv__io_t **)uv__realloc(ppuVar5,(ulong)(uVar6 + 1) << 3);
      if (ppuVar5 == (uv__io_t **)0x0) {
        abort();
      }
      uVar2 = uVar6 - 1;
      uVar3 = loop->nwatchers;
      if (uVar3 < uVar2) {
        memset(ppuVar5 + uVar3,0,(ulong)((uVar6 - uVar3) - 2) * 8 + 8);
      }
      ppuVar5[uVar2] = puVar7;
      ppuVar5[uVar6] = local_38;
      loop->watchers = ppuVar5;
      loop->nwatchers = uVar2;
    }
    if (w->events == w->pevents) {
      if (w->events == 0) {
        ppvVar1 = w->watcher_queue;
        if (ppvVar1 != (void **)w->watcher_queue[0]) {
          *(void **)w->watcher_queue[1] = w->watcher_queue[0];
          *(void **)((long)w->watcher_queue[0] + 8) = w->watcher_queue[1];
          w->watcher_queue[0] = ppvVar1;
          w->watcher_queue[1] = ppvVar1;
        }
      }
    }
    else {
      ppvVar1 = w->watcher_queue;
      if (ppvVar1 == (void **)w->watcher_queue[0]) {
        w->watcher_queue[0] = loop->watcher_queue;
        plVar4 = (long *)loop->watcher_queue[1];
        w->watcher_queue[1] = plVar4;
        *plVar4 = (long)ppvVar1;
        loop->watcher_queue[1] = ppvVar1;
      }
      if (loop->watchers[w->fd] == (uv__io_t *)0x0) {
        loop->watchers[w->fd] = w;
        loop->nfds = loop->nfds + 1;
      }
    }
    return;
  }
  __assert_fail("w->fd < INT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                ,0x340,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

void uv__io_start(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI)));
  assert(0 != events);
  assert(w->fd >= 0);
  assert(w->fd < INT_MAX);

  w->pevents |= events;
  maybe_resize(loop, w->fd + 1);

#if !defined(__sun)
  /* The event ports backend needs to rearm all file descriptors on each and
   * every tick of the event loop but the other backends allow us to
   * short-circuit here if the event mask is unchanged.
   */
  if (w->events == w->pevents)
    return;
#endif

  if (QUEUE_EMPTY(&w->watcher_queue))
    QUEUE_INSERT_TAIL(&loop->watcher_queue, &w->watcher_queue);

  if (loop->watchers[w->fd] == NULL) {
    loop->watchers[w->fd] = w;
    loop->nfds++;
  }
}